

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

double * __thiscall
google::protobuf::Map<long,_double>::at<long>(Map<long,_double> *this,key_arg<long> *key)

{
  LogMessage *pLVar1;
  LogFinisher local_61;
  const_iterator it;
  LogMessage local_48;
  
  InnerMap::find<long>(&it.it_,&this->elements_,key);
  if (it.it_.node_ == (Node *)0x0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    pLVar1 = internal::LogMessage::operator<<(&local_48,"CHECK failed: it != end(): ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"key not found: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,*key);
    internal::LogFinisher::operator=(&local_61,pLVar1);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return (double *)&(it.it_.node_)->field_0x8;
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }